

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObject::GetSharedData
          (CSharedMemoryObject *this,CPalThread *pthr,LockType eLockRequest,IDataLock **ppDataLock,
          void **ppvSharedData)

{
  CSimpleDataLock *pCVar1;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x3c0);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (WriteLock < eLockRequest) {
    fprintf(_stderr,"] %s %s:%d","GetSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x3c1);
    fprintf(_stderr,"Expression: ReadLock == eLockRequest || WriteLock == eLockRequest\n");
  }
  if (ppDataLock == (IDataLock **)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x3c2);
    fprintf(_stderr,"Expression: NULL != ppDataLock\n");
  }
  if (ppvSharedData == (void **)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x3c3);
    fprintf(_stderr,"Expression: NULL != ppvSharedData\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033bbde;
  if (((this->super_CPalObjectBase).m_pot)->m_dwSharedDataSize == 0) {
    fprintf(_stderr,"] %s %s:%d","GetSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x3cf);
    fprintf(_stderr,"Expression: 0 < m_pot->GetSharedDataSize()\n");
  }
  if (this->m_ObjectDomain == ProcessLocalObject) {
    pCVar1 = &this->m_sdlSharedData;
    InternalEnterCriticalSection(pthr,&(this->m_sdlSharedData).m_cs);
    if (this->m_ObjectDomain == SharedObject) {
      (**(pCVar1->super_IDataLock)._vptr_IDataLock)(pCVar1,pthr,0);
      goto LAB_0033bba9;
    }
  }
  else {
LAB_0033bba9:
    pCVar1 = (CSimpleDataLock *)&this->m_ssmlSharedData;
    SHMLock();
  }
  *ppDataLock = &pCVar1->super_IDataLock;
  *ppvSharedData = this->m_pvSharedData;
  if (PAL_InitializeChakraCoreCalled != false) {
    return 0;
  }
LAB_0033bbde:
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObject::GetSharedData(
    CPalThread *pthr,
    LockType eLockRequest,
    IDataLock **ppDataLock,             // OUT
    void **ppvSharedData                // OUT
    )
{
    IDataLock *pDataLock;

    _ASSERTE(NULL != pthr);
    _ASSERTE(ReadLock == eLockRequest || WriteLock == eLockRequest);
    _ASSERTE(NULL != ppDataLock);
    _ASSERTE(NULL != ppvSharedData);

    ENTRY("CSharedMemoryObject::GetSharedData"
        "(this = %p, pthr = %p, eLockRequest = %d, ppDataLock = %p,"
        " ppvSharedData = %p)\n",
        this,
        pthr,
        eLockRequest,
        ppDataLock,
        ppvSharedData
        );

    _ASSERTE(0 < m_pot->GetSharedDataSize());
    
    if (ProcessLocalObject == m_ObjectDomain)
    {
        //
        // We need to grab the local shared data lock and re-check
        // the object's domain, as there's a chance the object might
        // have been promoted after we made the above check but before
        // we grabbed the lock
        //

        m_sdlSharedData.AcquireLock(pthr, &pDataLock);

        if (SharedObject == m_ObjectDomain)
        {
            pDataLock->ReleaseLock(pthr, FALSE);
            m_ssmlSharedData.AcquireLock(pthr, &pDataLock);
        }
    }
    else
    {
        //
        // A shared object can never transition back to local,
        // so there's no need to recheck the domain on this path
        //
        
        m_ssmlSharedData.AcquireLock(pthr, &pDataLock);
    }

    *ppDataLock = pDataLock;
    *ppvSharedData = m_pvSharedData;

    LOGEXIT("CSharedMemoryObject::GetSharedData returns %d\n", NO_ERROR);
    
    return NO_ERROR;
}